

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O2

int32_t __thiscall
helics::HandleManager::getHandleOption(HandleManager *this,InterfaceHandle handle,int32_t option)

{
  bool bVar1;
  uint uVar2;
  reference pBVar3;
  ushort uVar4;
  
  bVar1 = isValidIndex<int,std::deque<helics::BasicHandleInfo,std::allocator<helics::BasicHandleInfo>>>
                    (handle.hid,&this->handles);
  uVar2 = 0;
  if (bVar1) {
    if (option == 0x18d) {
      uVar4 = 4;
    }
    else if (option == 0x192) {
      uVar4 = 0x100;
    }
    else if (option == 0x197) {
      uVar4 = 8;
    }
    else if (option == 0x19c) {
      uVar4 = 0x80;
    }
    else if (option == 0x1a6) {
      uVar4 = 0x4000;
    }
    else if (option == 0x1c6) {
      uVar4 = 0x40;
    }
    else {
      if (option != 0x1c4) {
        return 0;
      }
      uVar4 = 0x1000;
    }
    pBVar3 = std::
             _Deque_iterator<helics::BasicHandleInfo,_helics::BasicHandleInfo_&,_helics::BasicHandleInfo_*>
             ::operator[](&(this->handles).
                           super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                           ._M_impl.super__Deque_impl_data._M_start,(long)handle.hid);
    uVar2 = (uint)((pBVar3->flags & uVar4) != 0);
  }
  return uVar2;
}

Assistant:

int32_t HandleManager::getHandleOption(InterfaceHandle handle, int32_t option) const
{
    auto index = handle.baseValue();
    bool rvalue{false};
    if (isValidIndex(index, handles)) {
        switch (option) {
            case HELICS_HANDLE_OPTION_ONLY_UPDATE_ON_CHANGE:
                rvalue = checkActionFlag(handles[index], only_update_on_change_flag);
                break;
            case HELICS_HANDLE_OPTION_ONLY_TRANSMIT_ON_CHANGE:
                rvalue = checkActionFlag(handles[index], only_transmit_on_change_flag);
                break;
            case HELICS_HANDLE_OPTION_CONNECTION_REQUIRED:
                rvalue = checkActionFlag(handles[index], required_flag);
                break;
            case HELICS_HANDLE_OPTION_CONNECTION_OPTIONAL:
                rvalue = checkActionFlag(handles[index], optional_flag);
                break;
            case HELICS_HANDLE_OPTION_SINGLE_CONNECTION_ONLY:
                rvalue = checkActionFlag(handles[index], single_connection_flag);
                break;
            case HELICS_HANDLE_OPTION_RECONNECTABLE:
                rvalue = checkActionFlag(handles[index], reconnectable_flag);
                break;
            case HELICS_HANDLE_OPTION_RECEIVE_ONLY:
                rvalue = checkActionFlag(handles[index], receive_only_flag);
                break;
            default:
                break;
        }
    }
    return rvalue ? 1 : 0;
}